

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.hpp
# Opt level: O2

RealType __thiscall
QuantLib::Problem::valueAndGradient
          (Problem *this,DynamicVector<double,_std::allocator<double>_> *grad_f,
          DynamicVector<double,_std::allocator<double>_> *x)

{
  undefined4 uVar1;
  undefined4 uVar2;
  RealType extraout_XMM0_Qa;
  
  uVar1 = this->functionEvaluation_;
  uVar2 = this->gradientEvaluation_;
  this->functionEvaluation_ = uVar1 + 1;
  this->gradientEvaluation_ = uVar2 + 1;
  (*this->objectiveFunction_->_vptr_ObjectiveFunction[4])();
  this->functionValue_ = extraout_XMM0_Qa;
  (*this->statusFunction_->_vptr_StatusFunction[2])
            (this->statusFunction_,(ulong)(uint)this->functionEvaluation_,
             (ulong)(uint)this->gradientEvaluation_,&this->currentValue_);
  return this->functionValue_;
}

Assistant:

inline RealType Problem::valueAndGradient(DynamicVector<RealType>& grad_f,
                                            const DynamicVector<RealType>& x) {
    ++functionEvaluation_;
    ++gradientEvaluation_;
    functionValue_ = objectiveFunction_.valueAndGradient(grad_f, x);
    statusFunction_.writeStatus(functionEvaluation_, gradientEvaluation_,
                                currentValue_, functionValue_);
    return functionValue_;
  }